

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationtailoring.cpp
# Opt level: O0

void __thiscall icu_63::CollationTailoring::~CollationTailoring(CollationTailoring *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  CollationTailoring *this_local;
  
  (this->super_SharedObject).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CollationTailoring_005b57d0;
  SharedObject::clearPtr<icu_63::CollationSettings>(&this->settings);
  if (this->ownedData != (CollationData *)0x0) {
    UMemory::operator_delete((UMemory *)this->ownedData,in_RSI);
  }
  if (this->builder != (UObject *)0x0) {
    (*this->builder->_vptr_UObject[1])();
  }
  udata_close_63(this->memory);
  ures_close_63(this->bundle);
  utrie2_close_63(this->trie);
  this_00 = this->unsafeBackwardSet;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  uhash_close_63(this->maxExpansions);
  UInitOnce::reset(&this->maxExpansionsInitOnce);
  Locale::~Locale(&this->actualLocale);
  icu_63::UnicodeString::~UnicodeString(&this->rules);
  SharedObject::~SharedObject(&this->super_SharedObject);
  return;
}

Assistant:

CollationTailoring::~CollationTailoring() {
    SharedObject::clearPtr(settings);
    delete ownedData;
    delete builder;
    udata_close(memory);
    ures_close(bundle);
    utrie2_close(trie);
    delete unsafeBackwardSet;
    uhash_close(maxExpansions);
    maxExpansionsInitOnce.reset();
}